

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
do_deliver_message_to_subscriber
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this,
          subscriber_info_t *agent_info,deliver_op_tracer *tracer,type_index *msg_type,
          message_ref_t *message,uint overlimit_reaction_deep)

{
  anon_class_40_5_1f61f8e0 delivery_action;
  delivery_possibility_t dVar1;
  message_t *msg;
  agent_t *paVar2;
  control_block_t *limit;
  action_msg_tracer_t *tracer_00;
  delivery_possibility_t delivery_status;
  uint overlimit_reaction_deep_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  deliver_op_tracer *tracer_local;
  subscriber_info_t *agent_info_local;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  msg = intrusive_ptr_t<so_5::message_t>::get(message);
  dVar1 = local_mbox_details::subscriber_info_t::must_be_delivered(agent_info,msg);
  if (dVar1 == must_be_delivered) {
    paVar2 = local_mbox_details::subscriber_info_t::subscriber_reference(agent_info);
    limit = local_mbox_details::subscriber_info_t::limit(agent_info);
    tracer_00 = msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer::overlimit_tracer
                          (tracer);
    delivery_action.agent_info = agent_info;
    delivery_action.tracer = tracer;
    delivery_action.this = this;
    delivery_action.msg_type = msg_type;
    delivery_action.message = message;
    message_limit::impl::
    try_to_deliver_to_agent<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::do_deliver_message_to_subscriber(so_5::impl::local_mbox_details::subscriber_info_t_const&,so_5::impl::msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer_const&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,unsigned_int)const::_lambda()_1_>
              (event,paVar2,limit,msg_type,message,overlimit_reaction_deep,tracer_00,delivery_action
              );
  }
  else {
    paVar2 = local_mbox_details::subscriber_info_t::subscriber_pointer(agent_info);
    msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer::message_rejected
              (tracer,paVar2,dVar1);
  }
  return;
}

Assistant:

void
		do_deliver_message_to_subscriber(
			const local_mbox_details::subscriber_info_t & agent_info,
			typename TRACING_BASE::deliver_op_tracer const & tracer,
			const std::type_index & msg_type,
			const message_ref_t & message,
			unsigned int overlimit_reaction_deep ) const
			{
				const auto delivery_status =
						agent_info.must_be_delivered( *(message.get()) );

				if( delivery_possibility_t::must_be_delivered == delivery_status )
					{
						using namespace so_5::message_limit::impl;

						try_to_deliver_to_agent(
								invocation_type_t::event,
								agent_info.subscriber_reference(),
								agent_info.limit(),
								msg_type,
								message,
								overlimit_reaction_deep,
								tracer.overlimit_tracer(),
								[&] {
									tracer.push_to_queue( agent_info.subscriber_pointer() );

									agent_t::call_push_event(
											agent_info.subscriber_reference(),
											agent_info.limit(),
											m_id,
											msg_type,
											message );
								} );
					}
				else
					tracer.message_rejected(
							agent_info.subscriber_pointer(), delivery_status );
			}